

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall
UnitTests::Assert::Equals<char[11],std::__cxx11::string>
          (Assert *this,string *msg,char (*expected) [11],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  ostringstream s;
  undefined1 local_1e0 [32];
  Assert *local_1c0;
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  char (*local_1b0) [11];
  long *local_1a8;
  size_t local_1a0;
  long local_198;
  uint auStack_190 [88];
  
  local_1a8 = &local_198;
  sVar4 = strlen(*expected);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,expected,*expected + sVar4);
  local_1e0._0_8_ = local_1e0 + 0x10;
  pcVar1 = (actual->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,pcVar1 + actual->_M_string_length);
  uVar2 = local_1e0._0_8_;
  local_1c0 = this;
  if (local_1a0 == local_1e0._8_8_) {
    if (local_1a0 == 0) {
      bVar6 = true;
    }
    else {
      iVar3 = bcmp(local_1a8,(void *)local_1e0._0_8_,local_1a0);
      bVar6 = iVar3 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if ((string *)uVar2 != (string *)(local_1e0 + 0x10)) {
    operator_delete((void *)uVar2,local_1e0._16_8_ + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (bVar6) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (msg->_M_string_length != 0) {
    local_1e0._0_8_ = msg;
    poVar5 = details::operator<<((ostream *)&local_1a8,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  }
  *(uint *)((long)auStack_190 + local_1a8[-3]) = *(uint *)((long)auStack_190 + local_1a8[-3]) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"    Expected <",0xe);
  local_1e0._0_8_ = local_1e0 + 0x10;
  sVar4 = strlen(*expected);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,expected,*expected + sVar4);
  local_1b8.t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  local_1b0 = expected;
  poVar5 = details::streamit<std::__cxx11::string,char[11]>(&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">\n",2);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"     but got <",0xe);
  local_1e0._0_8_ = local_1e0 + 0x10;
  pcVar1 = (actual->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,pcVar1 + actual->_M_string_length);
  local_1b8.t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  poVar5 = details::operator<<((ostream *)&local_1a8,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">\n",2);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  ",2);
  std::__cxx11::stringbuf::str();
  Error(local_1c0,(string *)local_1e0);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }